

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void writeBPArmada(Manager *manager,int puzNum)

{
  pointer pBVar1;
  pointer pSVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long local_248;
  ofstream file;
  ios_base local_150 [264];
  ulong local_48;
  ulong local_40;
  char local_31;
  
  std::ofstream::ofstream(&local_248,"bpgArmada.txt",_S_out);
  if (0 < puzNum) {
    local_40 = (ulong)(uint)puzNum;
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_248,"\nArmada Format\n",0xf);
      pBVar1 = (manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = *(pointer *)&pBVar1[uVar7].armada.super__Vector_base<Ship,_std::allocator<Ship>_>;
      local_48 = uVar7;
      if (*(pointer *)
           ((long)&pBVar1[uVar7].armada.super__Vector_base<Ship,_std::allocator<Ship>_> + 8) !=
          pSVar2) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          local_31 = (&pSVar2->ID)[lVar5];
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_248,&local_31,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,*(int *)(*(long *)&(manager->puzzles).
                                                                                                                
                                                  super__Vector_base<Board,_std::allocator<Board>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  armada.
                                                  super__Vector_base<Ship,_std::allocator<Ship>_> +
                                              8 + lVar5));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,*(int *)(*(long *)&(manager->puzzles).
                                                                                                                
                                                  super__Vector_base<Board,_std::allocator<Board>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  armada.
                                                  super__Vector_base<Ship,_std::allocator<Ship>_> +
                                              0xc + lVar5));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_31 = *(char *)(*(long *)&(manager->puzzles).
                                         super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar7].armada.
                                         super__Vector_base<Ship,_std::allocator<Ship>_> + 0x10 +
                              lVar5);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_31,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          uVar6 = uVar6 + 1;
          pBVar1 = (manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar2 = *(pointer *)&pBVar1[uVar7].armada.super__Vector_base<Ship,_std::allocator<Ship>_>
          ;
          uVar4 = ((long)*(pointer *)
                          ((long)&pBVar1[uVar7].armada.
                                  super__Vector_base<Ship,_std::allocator<Ship>_> + 8) -
                   (long)pSVar2 >> 3) * -0x5555555555555555;
          lVar5 = lVar5 + 0x18;
        } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_248,"\n\n\n",3);
      uVar7 = local_48 + 1;
    } while (uVar7 != local_40);
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"File saved sucessfully! ;)",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_248 = _VTT;
  *(undefined8 *)((long)&local_248 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&file);
  std::ios_base::~ios_base(local_150);
  return;
}

Assistant:

void writeBPArmada( Manager manager, int puzNum )
{

    std::ofstream file("bpgArmada.txt");

    for( int vec = 0; vec < puzNum; vec++ )
    {
        file << "\nArmada Format\n";
        for( int i = 0; i < manager.puzzles[vec].armada.size(); i++ )
        {
            file << manager.puzzles[vec].armada[i].ID << " "
                 << manager.puzzles[vec].armada[i].sRow << " "
                 << manager.puzzles[vec].armada[i].sCol << " "
                 << manager.puzzles[vec].armada[i].orientation << "\n";
        }

         file << "\n\n\n";
    }

    file.close();

	std::cout << "File saved sucessfully! ;)" << std::endl;
}